

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int Curl_hash_init(Curl_hash *h,int slots,hash_function hfunc,comp_function comparator,
                  Curl_hash_dtor dtor)

{
  Curl_llist *pCVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = 1;
  if ((dtor != (Curl_hash_dtor)0x0 && comparator != (comp_function)0x0) &&
      (hfunc != (hash_function)0x0 && slots != 0)) {
    h->hash_func = hfunc;
    h->comp_func = comparator;
    h->dtor = dtor;
    h->size = 0;
    h->slots = slots;
    pCVar1 = (Curl_llist *)(*Curl_cmalloc)((long)slots << 5);
    h->table = pCVar1;
    if (pCVar1 == (Curl_llist *)0x0) {
      h->slots = 0;
    }
    else {
      iVar4 = 0;
      uVar3 = (ulong)(uint)slots;
      if (slots < 1) {
        uVar3 = 0;
      }
      for (lVar2 = 0; uVar3 * 0x20 != lVar2; lVar2 = lVar2 + 0x20) {
        Curl_llist_init((Curl_llist *)((long)&h->table->head + lVar2),hash_element_dtor);
      }
    }
  }
  return iVar4;
}

Assistant:

int
Curl_hash_init(struct Curl_hash *h,
               int slots,
               hash_function hfunc,
               comp_function comparator,
               Curl_hash_dtor dtor)
{
  if(!slots || !hfunc || !comparator ||!dtor) {
    return 1; /* failure */
  }

  h->hash_func = hfunc;
  h->comp_func = comparator;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;

  h->table = malloc(slots * sizeof(struct Curl_llist));
  if(h->table) {
    int i;
    for(i = 0; i < slots; ++i)
      Curl_llist_init(&h->table[i], (Curl_llist_dtor) hash_element_dtor);
    return 0; /* fine */
  }
  h->slots = 0;
  return 1; /* failure */
}